

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O3

bool __thiscall FIX::SocketAcceptor::onPoll(SocketAcceptor *this)

{
  bool bVar1;
  time_t tVar2;
  time_t start;
  time_t now;
  time_t local_18 [2];
  
  if (this->m_pServer == (SocketServer *)0x0) {
    return false;
  }
  local_18[0] = 0;
  local_18[1] = 0;
  if (((this->super_Acceptor).m_stop._M_base._M_i & 1U) != 0) {
    time(local_18);
    bVar1 = Acceptor::isLoggedOn(&this->super_Acceptor);
    if ((!bVar1) || (tVar2 = time(local_18 + 1), local_18[0] <= tVar2 + -5)) {
      return false;
    }
  }
  SocketServer::block(this->m_pServer,&this->super_Strategy,true,0.0);
  return true;
}

Assistant:

bool SocketAcceptor::onPoll() {
  if (!m_pServer) {
    return false;
  }

  time_t start = 0;
  time_t now = 0;

  if (isStopped()) {
    if (start == 0) {
      ::time(&start);
    }
    if (!isLoggedOn()) {
      start = 0;
      return false;
    }
    if (::time(&now) - 5 >= start) {
      start = 0;
      return false;
    }
  }

  m_pServer->block(*this, true);
  return true;
}